

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper_ssl.cpp
# Opt level: O2

void __thiscall license::CryptoHelperLinux::generateKeyPair(CryptoHelperLinux *this)

{
  int iVar1;
  EVP_PKEY_CTX *ctx;
  logic_error *this_00;
  
  if ((EVP_PKEY *)this->m_pktmp != (EVP_PKEY *)0x0) {
    EVP_PKEY_free((EVP_PKEY *)this->m_pktmp);
    this->m_pktmp = (EVP_PKEY *)0x0;
  }
  ctx = EVP_PKEY_CTX_new_id(6,(ENGINE *)0x0);
  EVP_PKEY_keygen_init(ctx);
  iVar1 = EVP_PKEY_CTX_set_rsa_keygen_bits(ctx,0x400);
  if (iVar1 < 1) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"error setting key properties");
  }
  else {
    iVar1 = EVP_PKEY_keygen(ctx,(EVP_PKEY **)&this->m_pktmp);
    if (0 < iVar1) {
      EVP_PKEY_CTX_free(ctx);
      return;
    }
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"error generating keypair");
  }
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void CryptoHelperLinux::generateKeyPair() {
	if (m_pktmp) {
		EVP_PKEY_free(m_pktmp);
		m_pktmp = nullptr;
	}

	EVP_PKEY_CTX *ctx;

	ctx = EVP_PKEY_CTX_new_id(EVP_PKEY_RSA, NULL);
	if (!ctx) {
	}

	if (EVP_PKEY_keygen_init(ctx) <= 0) {
	}

	if (EVP_PKEY_CTX_set_rsa_keygen_bits(ctx, 1024) <= 0) {
		throw logic_error("error setting key properties");
	}

	if (EVP_PKEY_keygen(ctx, &m_pktmp) <= 0) {
		throw logic_error("error generating keypair");
	}
	EVP_PKEY_CTX_free(ctx);
}